

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

wchar_t ignore_collect_kind(wchar_t tval,ignore_choice **ch)

{
  _Bool _Var1;
  ignore_choice *p;
  object_kind *kind_00;
  object_kind *kind;
  wchar_t i;
  wchar_t num;
  ignore_choice *choice;
  ignore_choice **ch_local;
  wchar_t tval_local;
  
  kind._4_4_ = L'\0';
  p = (ignore_choice *)mem_alloc((long)(int)((uint)z_info->k_max << 1) << 4);
  for (kind._0_4_ = 1; (int)kind < (int)(uint)z_info->k_max; kind._0_4_ = (int)kind + 1) {
    kind_00 = k_info + (int)kind;
    if ((kind_00->name != (char *)0x0) && (kind_00->tval == tval)) {
      if ((kind_00->aware & 1U) == 0) {
        p[kind._4_4_].kind = kind_00;
        p[kind._4_4_].aware = false;
        kind._4_4_ = kind._4_4_ + L'\x01';
      }
      if ((((kind_00->everseen & 1U) != 0) &&
          (_Var1 = flag_has_dbg(kind_00->kind_flags,4,0x12,"kind->kind_flags","KF_INSTA_ART"),
          !_Var1)) || (_Var1 = tval_is_money_k(kind_00), _Var1)) {
        p[kind._4_4_].kind = kind_00;
        p[kind._4_4_].aware = true;
        kind._4_4_ = kind._4_4_ + L'\x01';
      }
    }
  }
  if (kind._4_4_ == L'\0') {
    mem_free(p);
  }
  else {
    *ch = p;
  }
  return kind._4_4_;
}

Assistant:

static int ignore_collect_kind(int tval, ignore_choice **ch)
{
	ignore_choice *choice;
	int num = 0;

	int i;

	/* Create the array, with entries both for aware and unaware ignore */
	choice = mem_alloc(2 * z_info->k_max * sizeof *choice);

	for (i = 1; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Skip empty objects, unseen objects, and incorrect tvals */
		if (!kind->name || kind->tval != tval)
			continue;

		if (!kind->aware) {
			/* can unaware ignore anything */
			choice[num].kind = kind;
			choice[num++].aware = false;
		}

		if ((kind->everseen && !kf_has(kind->kind_flags, KF_INSTA_ART)) || 
			tval_is_money_k(kind)) {
			/* Do not display the artifact base kinds in this list 
			 * aware ignore requires everseen 
			 * do not require awareness for aware ignore, so people can set 
			 * at game start */
			choice[num].kind = kind;
			choice[num++].aware = true;
		}
	}

	if (num == 0)
		mem_free(choice);
	else
		*ch = choice;

	return num;
}